

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_suite.cpp
# Opt level: O0

void find_array(void)

{
  bool bVar1;
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_7c0;
  undefined4 local_7b4;
  iterator local_7b0;
  iterator local_798;
  iterator local_780;
  iterator local_768;
  difference_type local_750 [2];
  iterator local_740;
  iterator local_728;
  iterator local_710;
  iterator local_6f8;
  undefined4 local_6dc;
  iterator local_6d8;
  iterator local_6c0;
  iterator local_6a8;
  iterator local_690;
  difference_type local_678 [2];
  iterator local_668;
  iterator local_650;
  iterator local_638;
  iterator local_620;
  undefined4 local_604;
  iterator local_600;
  iterator local_5e8;
  iterator local_5d0;
  iterator local_5b8;
  difference_type local_5a0 [2];
  iterator local_590;
  iterator local_578;
  iterator local_560;
  iterator local_548;
  undefined4 local_52c;
  iterator local_528;
  iterator local_510;
  iterator local_4f8;
  iterator local_4e0;
  difference_type local_4c8 [2];
  iterator local_4b8;
  iterator local_4a0;
  iterator local_488;
  iterator local_470;
  undefined4 local_454;
  double local_450;
  iterator local_448;
  iterator local_430;
  iterator local_418;
  iterator local_400;
  difference_type local_3e8 [2];
  iterator local_3d8;
  double local_3c0;
  iterator local_3b8;
  iterator local_3a0;
  iterator local_388;
  undefined4 local_370;
  int local_36c;
  iterator local_368;
  iterator local_350;
  iterator local_338;
  iterator local_320;
  difference_type local_308 [2];
  iterator local_2f8;
  int local_2dc;
  iterator local_2d8;
  iterator local_2c0;
  iterator local_2a8;
  undefined4 local_290;
  bool local_289;
  iterator local_288;
  iterator local_270;
  iterator local_258;
  iterator local_240;
  difference_type local_228 [2];
  iterator local_218;
  bool local_1f9;
  iterator local_1f8;
  iterator local_1e0;
  iterator local_1c8;
  basic_variable<std::allocator<char>_> *local_1a0;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_1a0 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_1a0,true);
  local_1a0 = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1a0,2);
  local_1a0 = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1a0,3.0);
  local_1a0 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,"alpha");
  local_1a0 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"bravo");
  local_1a0 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"charlie");
  local_1a0 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"delta");
  local_48._0_8_ = &local_198;
  local_48._8_8_ = 7;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_7c0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_7c0 = local_7c0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_7c0);
  } while (local_7c0 != &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1f8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_1f9 = false;
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,bool>
            (&local_1c8,&local_1e0,&local_1f8,&local_1f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_218,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    (&local_1c8,&local_218);
  boost::detail::test_impl
            ("std::find(data.begin(), data.end(), false) == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x57,"void find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_240,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_270,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_288,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_289 = true;
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,bool>
            (&local_258,&local_270,&local_288,&local_289);
  local_228[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_240,&local_258);
  local_290 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), std::find(data.begin(), data.end(), true))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x5a,"void find_array()",local_228,&local_290);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_270);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_240);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2c0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2d8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_2dc = 0x2a;
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
            (&local_2a8,&local_2c0,&local_2d8,&local_2dc);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2f8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    (&local_2a8,&local_2f8);
  boost::detail::test_impl
            ("std::find(data.begin(), data.end(), 42) == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x5c,"void find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_320,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_350,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_368,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_36c = 2;
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
            (&local_338,&local_350,&local_368,&local_36c);
  local_308[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_320,&local_338);
  local_370 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), std::find(data.begin(), data.end(), 2))","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x5f,"void find_array()",local_308,&local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_368);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_350);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_320);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3a0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_3c0 = 43.0;
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,double>
            (&local_388,&local_3a0,&local_3b8,&local_3c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3d8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    (&local_388,&local_3d8);
  boost::detail::test_impl
            ("std::find(data.begin(), data.end(), 43.0) == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x61,"void find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_400,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_430,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_448,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_450 = 3.0;
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,double>
            (&local_418,&local_430,&local_448,&local_450);
  local_3e8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_400,&local_418);
  local_454 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), std::find(data.begin(), data.end(), 3.0))","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,100,"void find_array()",local_3e8,&local_454);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_448);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_430);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_400);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_488,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_4a0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char[1]>
            (&local_470,&local_488,&local_4a0,(char (*) [1])0x129f4d);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_4b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    (&local_470,&local_4b8);
  boost::detail::test_impl
            ("std::find(data.begin(), data.end(), \"\") == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x66,"void find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_470);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_488);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_510,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_528,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char[6]>
            (&local_4f8,&local_510,&local_528,(char (*) [6])"alpha");
  local_4c8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_4e0,&local_4f8);
  local_52c = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), std::find(data.begin(), data.end(), \"alpha\"))","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x69,"void find_array()",local_4c8,&local_52c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_528);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_510);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_560,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_578,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,wchar_t[1]>
            (&local_548,&local_560,&local_578,(wchar_t (*) [1])0x12b490);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_590,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    (&local_548,&local_590);
  boost::detail::test_impl
            ("std::find(data.begin(), data.end(), L\"\") == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x6a,"void find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_590);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_578);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_560);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_600,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,wchar_t[6]>
            (&local_5d0,&local_5e8,&local_600,(wchar_t (*) [6])L"bravo");
  local_5a0[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_5b8,&local_5d0);
  local_604 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), std::find(data.begin(), data.end(), L\"bravo\"))","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x6d,"void find_array()",local_5a0,&local_604);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_600);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_638,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_650,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char16_t[1]>
            (&local_620,&local_638,&local_650,(char16_t (*) [1])0x12b4a2);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_668,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    (&local_620,&local_668);
  boost::detail::test_impl
            ("std::find(data.begin(), data.end(), u\"\") == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x6e,"void find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_620);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_650);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_638);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_690,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6c0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_6d8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char16_t[8]>
            (&local_6a8,&local_6c0,&local_6d8,(char16_t (*) [8])L"charlie");
  local_678[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_690,&local_6a8);
  local_6dc = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), std::find(data.begin(), data.end(), u\"charlie\"))","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x71,"void find_array()",local_678,&local_6dc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_690);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_710,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_728,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char32_t[1]>
            (&local_6f8,&local_710,&local_728,(char32_t (*) [1])0x12b490);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_740,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    (&local_6f8,&local_740);
  boost::detail::test_impl
            ("std::find(data.begin(), data.end(), U\"\") == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x72,"void find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_740);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_728);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_710);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_768,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_798,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_7b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char32_t[6]>
            (&local_780,&local_798,&local_7b0,(char32_t (*) [6])L"delta");
  local_750[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_768,&local_780);
  local_7b4 = 6;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), std::find(data.begin(), data.end(), U\"delta\"))","6",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x75,"void find_array()",local_750,&local_7b4);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_780);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_768);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void find_array()
{
    variable data = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });

    TRIAL_PROTOCOL_TEST(std::find(data.begin(), data.end(), false) == data.end());
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(),
                                            std::find(data.begin(), data.end(), true)),
                              0);

    TRIAL_PROTOCOL_TEST(std::find(data.begin(), data.end(), 42) == data.end());
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(),
                                            std::find(data.begin(), data.end(), 2)),
                              1);

    TRIAL_PROTOCOL_TEST(std::find(data.begin(), data.end(), 43.0) == data.end());
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(),
                                            std::find(data.begin(), data.end(), 3.0)),
                              2);

    TRIAL_PROTOCOL_TEST(std::find(data.begin(), data.end(), "") == data.end());
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(),
                                            std::find(data.begin(), data.end(), "alpha")),
                              3);
    TRIAL_PROTOCOL_TEST(std::find(data.begin(), data.end(), L"") == data.end());
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(),
                                            std::find(data.begin(), data.end(), L"bravo")),
                              4);
    TRIAL_PROTOCOL_TEST(std::find(data.begin(), data.end(), u"") == data.end());
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(),
                                            std::find(data.begin(), data.end(), u"charlie")),
                              5);
    TRIAL_PROTOCOL_TEST(std::find(data.begin(), data.end(), U"") == data.end());
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(),
                                            std::find(data.begin(), data.end(), U"delta")),
                              6);
}